

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

VOID DebugBreak(void)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  BOOL BVar4;
  __pid_t __pid;
  __pid_t _Var5;
  char *pcVar6;
  size_t sVar7;
  size_t sVar8;
  int *piVar9;
  long lVar10;
  long in_FS_OFFSET;
  char *local_d8;
  char *argv [4];
  undefined1 local_a8 [4];
  Volatile<int> spin;
  char local_68 [8];
  char pid_buf [45];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  if (!PAL_InitializeChakraCoreCalled) goto LAB_002ba307;
  pcVar6 = getenv("PAL_RUN_ON_DEBUG_BREAK");
  if (pcVar6 == (char *)0x0) {
LAB_002ba2a6:
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_002ba307;
    DBG_DebugBreak();
  }
  else {
    if (exe_module.lib_name == (LPWSTR)0x0) {
      lVar10 = 10;
    }
    else {
      sVar7 = PAL_wcslen(exe_module.lib_name);
      lVar10 = (long)(int)sVar7;
    }
    sVar8 = strlen("PAL_EXE_NAME=");
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_a8,sVar8 + lVar10 + 1);
    if (local_a8 == (char *)0x0) {
LAB_002ba278:
      StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_a8);
LAB_002ba28b:
      fprintf(_stderr,"Failed to execute command: \'%s\'\n",pcVar6);
      goto LAB_002ba2a6;
    }
    uVar2 = getpid();
    iVar3 = snprintf(local_68,0x2d,"PAL_EXE_PID=%d",(ulong)uVar2);
    if (iVar3 < 1) goto LAB_002ba278;
    sVar8 = sVar8 + lVar10 + 2;
    iVar3 = snprintf(local_a8,sVar8,"PAL_EXE_NAME=%ls",exe_module.lib_name);
    if (iVar3 < 1) goto LAB_002ba278;
    local_a8[0] = '\0';
    BVar4 = MiscPutenv(local_68,0);
    if ((BVar4 == 0) || (BVar4 = MiscPutenv(local_a8,0), BVar4 == 0)) goto LAB_002ba278;
    printf("Spawning command: %s\n",pcVar6);
    __pid = fork();
    if (__pid == -1) {
      StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_a8);
      goto LAB_002ba28b;
    }
    if (__pid == 0) {
      local_d8 = "sh";
      argv[0] = "-c";
      argv[2] = (char *)0x0;
      argv[1] = pcVar6;
      execv("/bin/sh",&local_d8);
      exit(0x7f);
    }
    do {
      local_d8 = (char *)((ulong)local_d8 & 0xffffffff00000000);
      _Var5 = waitpid(__pid,(int *)&local_d8,1);
      if (_Var5 == 0) {
LAB_002ba22a:
        bVar1 = true;
      }
      else {
        if (_Var5 == -1) {
          piVar9 = __errno_location();
          if (*piVar9 == 4) goto LAB_002ba22a;
          sVar8 = 0xffffffff;
        }
        else {
          if (((ulong)local_d8 & 0x7f) != 0) {
            sVar8 = 0xffffffff;
            bVar1 = false;
            fprintf(_stderr,"unexpected return from waitpid\n");
            goto LAB_002ba26d;
          }
          sVar8 = (size_t)((uint)local_d8 >> 8 & 0xff);
        }
        bVar1 = false;
      }
LAB_002ba26d:
    } while (bVar1);
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_a8);
    if ((int)sVar8 != 0) goto LAB_002ba28b;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == stack0xffffffffffffffc8) {
      return;
    }
    __stack_chk_fail();
  }
LAB_002ba307:
  abort();
}

Assistant:

VOID
PALAPI
DebugBreak(
       VOID)
{
    PERF_ENTRY(DebugBreak);
    ENTRY("DebugBreak()\n");

    if (DebugBreakCommand() <= 0) {
        // either didn't do anything, or failed
        TRACE("Calling DBG_DebugBreak\n");
        DBG_DebugBreak();
    }

    LOGEXIT("DebugBreak returns\n");
    PERF_EXIT(DebugBreak);
}